

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

void __thiscall
wasm::EquivalentClass::merge
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params)

{
  pointer target;
  Builder BVar1;
  bool bVar2;
  Function *shared;
  Module *pMVar3;
  reference ppFVar4;
  Expression *local_80;
  reference local_78;
  ParamInfo *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> extraArgs;
  Function *func;
  Builder builder;
  size_t i;
  Function *sharedFn;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params_local;
  Module *module_local;
  EquivalentClass *this_local;
  
  shared = createShared(this,module,params);
  builder.wasm = (Module *)0x0;
  while( true ) {
    BVar1.wasm = builder.wasm;
    pMVar3 = (Module *)
             std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                       (&this->functions);
    if (pMVar3 <= BVar1.wasm) break;
    Builder::Builder((Builder *)&func,module);
    ppFVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                        (&this->functions,(size_type)builder.wasm);
    extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppFVar4;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
    __end2 = std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::begin(params);
    param = (ParamInfo *)std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::end(params)
    ;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
                                  *)&param);
      target = extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (!bVar2) break;
      local_78 = __gnu_cxx::
                 __normal_iterator<const_wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
                 ::operator*(&__end2);
      local_80 = ParamInfo::lowerToExpression(local_78,(Builder *)&func,module,(size_t)builder.wasm)
      ;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                 &local_80);
      __gnu_cxx::
      __normal_iterator<const_wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
      ::operator++(&__end2);
    }
    bVar2 = FeatureSet::hasTailCall(&module->features);
    replaceWithThunk(this,(Builder *)&func,(Function *)target,shared,params,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                     bVar2);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
    builder.wasm = (Module *)
                   ((long)&((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void EquivalentClass::merge(Module* module,
                            const std::vector<ParamInfo>& params) {
  Function* sharedFn = createShared(module, params);
  for (size_t i = 0; i < functions.size(); ++i) {
    Builder builder(*module);
    auto* func = functions[i];
    std::vector<Expression*> extraArgs;
    for (auto& param : params) {
      extraArgs.push_back(param.lowerToExpression(builder, module, i));
    }
    replaceWithThunk(builder,
                     func,
                     sharedFn,
                     params,
                     extraArgs,
                     module->features.hasTailCall());
  }
  return;
}